

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O1

bool __thiscall Sock::SetNonBlocking(Sock *this)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = false;
  uVar2 = fcntl(this->m_socket,3,0);
  if (uVar2 != 0xffffffff) {
    iVar3 = fcntl(this->m_socket,4,(ulong)(uVar2 | 0x800));
    bVar4 = iVar3 != -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool Sock::SetNonBlocking() const
{
#ifdef WIN32
    u_long on{1};
    if (ioctlsocket(m_socket, FIONBIO, &on) == SOCKET_ERROR) {
        return false;
    }
#else
    const int flags{fcntl(m_socket, F_GETFL, 0)};
    if (flags == SOCKET_ERROR) {
        return false;
    }
    if (fcntl(m_socket, F_SETFL, flags | O_NONBLOCK) == SOCKET_ERROR) {
        return false;
    }
#endif
    return true;
}